

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

Type metaf::CloudType::cloudTypeOrObscurationFromString(string *s)

{
  bool bVar1;
  Type TVar2;
  
  TVar2 = cloudTypeFromString(s);
  if (TVar2 == NOT_REPORTED) {
    bVar1 = std::operator==(s,"BLSN");
    if (bVar1) {
      TVar2 = BLOWING_SNOW;
    }
    else {
      bVar1 = std::operator==(s,"BLDU");
      if (bVar1) {
        TVar2 = BLOWING_DUST;
      }
      else {
        bVar1 = std::operator==(s,"BLSA");
        if (bVar1) {
          TVar2 = BLOWING_SAND;
        }
        else {
          bVar1 = std::operator==(s,"IC");
          if (bVar1) {
            TVar2 = ICE_CRYSTALS;
          }
          else {
            bVar1 = std::operator==(s,"RA");
            if (bVar1) {
              TVar2 = RAIN;
            }
            else {
              bVar1 = std::operator==(s,"DZ");
              if (bVar1) {
                TVar2 = DRIZZLE;
              }
              else {
                bVar1 = std::operator==(s,"SN");
                if (bVar1) {
                  TVar2 = SNOW;
                }
                else {
                  bVar1 = std::operator==(s,"PL");
                  if (bVar1) {
                    TVar2 = ICE_PELLETS;
                  }
                  else {
                    bVar1 = std::operator==(s,"FU");
                    if (bVar1) {
                      TVar2 = SMOKE;
                    }
                    else {
                      bVar1 = std::operator==(s,"FG");
                      if (bVar1) {
                        TVar2 = FOG;
                      }
                      else {
                        bVar1 = std::operator==(s,"BR");
                        if (bVar1) {
                          TVar2 = MIST;
                        }
                        else {
                          bVar1 = std::operator==(s,"HZ");
                          if (bVar1) {
                            TVar2 = HAZE;
                          }
                          else {
                            bVar1 = std::operator==(s,"VA");
                            TVar2 = VOLCANIC_ASH;
                            if (!bVar1) {
                              TVar2 = NOT_REPORTED;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return TVar2;
}

Assistant:

CloudType::Type CloudType::cloudTypeOrObscurationFromString(const std::string & s) {
	if (const auto t = cloudTypeFromString(s); t != Type::NOT_REPORTED) return t;
	if (s == "BLSN")  return Type::BLOWING_SNOW;
	if (s == "BLDU")  return Type::BLOWING_DUST;
	if (s == "BLSA")  return Type::BLOWING_SAND;
	if (s == "IC")    return Type::ICE_CRYSTALS;
	if (s == "RA")    return Type::RAIN;
	if (s == "DZ")    return Type::DRIZZLE;
	if (s == "SN")    return Type::SNOW;
	if (s == "PL")    return Type::ICE_PELLETS;
	if (s == "FU")    return Type::SMOKE;
	if (s == "FG")    return Type::FOG;
	if (s == "BR")    return Type::MIST;
	if (s == "HZ")    return Type::HAZE;
	if (s == "VA") 	  return Type::VOLCANIC_ASH;
	return Type::NOT_REPORTED;
}